

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

int __thiscall FileTokenizer::init(FileTokenizer *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Alloc_hider _Var10;
  _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *this_00;
  string local_188;
  ValueType *local_168;
  string *local_160;
  undefined1 local_158 [64];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [64];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Token local_90;
  
  std::__cxx11::_List_base<Token,_std::allocator<Token>_>::_M_clear
            ((_List_base<Token,_std::allocator<Token>_> *)this);
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
  _M_size = 0;
  this->lineNumber = 1;
  this->linePos = 0;
  this->equActive = false;
  TextFile::readLine_abi_cxx11_(&local_188,(TextFile *)ctx);
  local_160 = (string *)&this->currentLine;
  uVar8 = std::__cxx11::string::operator=(local_160,(string *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    uVar8 = extraout_RAX;
  }
  this->input = (TextFile *)ctx;
  iVar7 = (int)CONCAT71((int7)((ulong)uVar8 >> 8),1);
  if (ctx[0x269] == (EVP_PKEY_CTX)0x0) {
    iVar7 = std::__basic_file<char>::is_open();
  }
  if ((char)iVar7 == '\0') {
    return iVar7;
  }
  local_168 = &(this->token).value;
  while ((this->linePos < (this->currentLine)._M_string_length ||
         (bVar6 = TextFile::atEnd(this->input), !bVar6))) {
    skipWhitespace(this);
    uVar1 = (this->currentLine)._M_string_length;
    uVar2 = this->linePos;
    if (uVar2 < uVar1) {
      bVar6 = *(char *)(*(long *)local_160 + uVar2) == '\\';
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      this->linePos = uVar2 + 1;
      skipWhitespace(this);
      if (this->linePos < (this->currentLine)._M_string_length) {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_188,"Unexpected character after line continuation character","")
        ;
        createToken(this,Invalid,0,&local_188,0,local_188._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        local_f8._0_8_ = (this->token).line;
        local_f8._8_5_ = (undefined5)(this->token).column;
        uVar8 = *(undefined8 *)((long)&(this->token).column + 5);
        local_f8._13_3_ = (undefined3)uVar8;
        local_f8._16_5_ = (undefined5)((ulong)uVar8 >> 0x18);
        this_00 = (_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                   *)(local_f8 + 0x18);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)this_00,
                        (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)local_168);
        local_b8._M_p = (pointer)&local_a8;
        pcVar3 = (this->token).originalText._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar3,pcVar3 + (this->token).originalText._M_string_length);
        std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                  ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_f8);
        paVar9 = &local_a8;
        _Var10._M_p = local_b8._M_p;
LAB_0014dcb4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != paVar9) {
          operator_delete(_Var10._M_p,paVar9->_M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage(this_00);
      }
    }
    else if (uVar2 < uVar1) {
      loadToken(&local_90,this);
      std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,&local_90);
      paVar9 = &local_90.originalText.field_2;
      this_00 = (_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier> *)
                &local_90.value;
      _Var10._M_p = local_90.originalText._M_dataplus._M_p;
      goto LAB_0014dcb4;
    }
    if ((this->currentLine)._M_string_length <= this->linePos) {
      if (!bVar6) {
        createToken(this,Separator,0);
        local_158._16_5_ =
             (undefined5)((ulong)*(undefined8 *)((long)&(this->token).column + 5) >> 0x18);
        local_158._0_8_ = (this->token).line;
        sVar5 = (this->token).column;
        local_158._8_5_ = (undefined5)sVar5;
        local_158._13_3_ = (undefined3)(sVar5 >> 0x28);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        _Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)(local_158 + 0x18),
                        (_Copy_ctor_base<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                         *)local_168);
        local_118._M_p = (pointer)&local_108;
        pcVar3 = (this->token).originalText._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar3,pcVar3 + (this->token).originalText._M_string_length)
        ;
        std::__cxx11::list<Token,_std::allocator<Token>_>::_M_insert<Token>
                  ((list<Token,_std::allocator<Token>_> *)this,(iterator)this,(Token *)local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p != &local_108) {
          operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>::
        ~_Variant_storage((_Variant_storage<false,_std::monostate,_long,_double,_StringLiteral,_Identifier>
                           *)(local_158 + 0x18));
      }
      bVar6 = TextFile::atEnd((TextFile *)ctx);
      if (bVar6) break;
      TextFile::readLine_abi_cxx11_(&local_188,(TextFile *)ctx);
      std::__cxx11::string::operator=(local_160,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      this->linePos = 0;
      this->lineNumber = this->lineNumber + 1;
    }
  }
  p_Var4 = (this->super_Tokenizer).tokens.super__List_base<Token,_std::allocator<Token>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (this->super_Tokenizer).position.it._M_node = p_Var4;
  return (int)CONCAT71((int7)((ulong)p_Var4 >> 8),(char)iVar7);
}

Assistant:

bool FileTokenizer::init(TextFile* input)
{
	clearTokens();

	lineNumber = 1;
	linePos = 0;
	equActive = false;
	currentLine = input->readLine();

	this->input = input;
	if (input != nullptr && input->isOpen())
	{
		while (!isInputAtEnd())
		{
			bool addSeparator = true;

			skipWhitespace();
			if (isContinuation(currentLine, linePos))
			{
				linePos++;
				skipWhitespace();
				if (linePos < currentLine.size())
				{
					createToken(TokenType::Invalid,0,
						"Unexpected character after line continuation character");
					addToken(token);
				}

				addSeparator = false;
			} else if(linePos < currentLine.size())
			{
				addToken(loadToken());
			}

			if (linePos >= currentLine.size())
			{
				if (addSeparator)
				{
					createToken(TokenType::Separator,0);
					addToken(token);
				}

				if (input->atEnd())
					break;

				currentLine = input->readLine();
				linePos = 0;
				lineNumber++;
			}
		}

		resetPosition();
		return true;
	}

	return false;
}